

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void aom_hadamard_32x32_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined8 uVar1;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long in_RCX;
  longlong in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_03;
  __m128i *in_R8;
  __m128i *in_R9;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i zero_00;
  __m128i zero_01;
  __m128i zero_02;
  __m128i zero_03;
  __m128i in;
  __m128i in_00;
  __m128i in_01;
  __m128i in_02;
  __m128i coeff3;
  __m128i coeff2;
  __m128i coeff1;
  __m128i coeff0;
  int16_t *src_ptr;
  __m128i zero;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i b3_hi;
  __m128i b2_hi;
  __m128i b1_hi;
  __m128i b0_hi;
  __m128i coeff3_hi;
  __m128i coeff2_hi;
  __m128i coeff1_hi;
  __m128i coeff0_hi;
  __m128i b3_lo;
  __m128i b2_lo;
  __m128i b1_lo;
  __m128i b0_lo;
  __m128i coeff3_lo;
  __m128i coeff2_lo;
  __m128i coeff1_lo;
  __m128i coeff0_lo;
  int idx;
  int16_t *t_coeff;
  int16_t temp_coeff [1024];
  tran_low_t *ptVar12;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  int local_c10;
  int iStack_c0c;
  int iStack_c08;
  int iStack_c04;
  int local_c00;
  int iStack_bfc;
  int iStack_bf8;
  int iStack_bf4;
  int local_bf0;
  int iStack_bec;
  int iStack_be8;
  int iStack_be4;
  int local_be0;
  int iStack_bdc;
  int iStack_bd8;
  int iStack_bd4;
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [20];
  int local_b8c;
  undefined1 *local_b88;
  undefined1 local_b80 [236];
  int in_stack_fffffffffffff56c;
  tran_low_t *in_stack_fffffffffffff570;
  ptrdiff_t in_stack_fffffffffffff578;
  int16_t *in_stack_fffffffffffff580;
  short local_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short sStack_328;
  short sStack_326;
  short sStack_324;
  short sStack_322;
  short local_320;
  short sStack_31e;
  short sStack_31c;
  short sStack_31a;
  short sStack_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  int local_2b0;
  int iStack_2ac;
  int iStack_2a8;
  int iStack_2a4;
  int local_2a0;
  int iStack_29c;
  int iStack_298;
  int iStack_294;
  int local_290;
  int iStack_28c;
  int iStack_288;
  int iStack_284;
  int local_280;
  int iStack_27c;
  int iStack_278;
  int iStack_274;
  int local_270;
  int iStack_26c;
  int iStack_268;
  int iStack_264;
  int local_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  int local_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  int local_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  
  local_b88 = local_b80;
  for (local_b8c = 0; local_b8c < 4; local_b8c = local_b8c + 1) {
    in_RCX = 0;
    hadamard_16x16_sse2(in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                        in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
    in_RDX = extraout_RDX;
  }
  for (local_b8c = 0; local_b8c < 0x100; local_b8c = local_b8c + 8) {
    ptVar12 = *(tran_low_t **)(local_b88 + 0x400);
    uVar1 = *(undefined8 *)(local_b88 + 0x408);
    uVar13 = (undefined2)uVar1;
    uVar14 = (undefined2)((ulong)uVar1 >> 0x10);
    uVar15 = (undefined2)((ulong)uVar1 >> 0x20);
    uVar16 = (undefined2)((ulong)uVar1 >> 0x30);
    zero_00[1] = in_RCX;
    zero_00[0] = in_RDX;
    in[1] = (longlong)local_c20;
    in[0] = (longlong)local_ba0;
    sign_extend_16bit_to_32bit_sse2(in,zero_00,in_R8,in_R9);
    zero_01[1] = in_RCX;
    zero_01[0] = extraout_RDX_00;
    in_00[1] = (longlong)local_c30;
    in_00[0] = (longlong)local_bb0;
    sign_extend_16bit_to_32bit_sse2(in_00,zero_01,in_R8,in_R9);
    zero_02[1] = in_RCX;
    zero_02[0] = extraout_RDX_01;
    in_01[1] = (longlong)local_c40;
    in_01[0] = (longlong)local_bc0;
    sign_extend_16bit_to_32bit_sse2(in_01,zero_02,in_R8,in_R9);
    zero_03[1] = in_RCX;
    zero_03[0] = extraout_RDX_02;
    in_02[1] = (longlong)local_c50;
    in_02[0] = (longlong)local_bd0;
    sign_extend_16bit_to_32bit_sse2(in_02,zero_03,in_R8,in_R9);
    local_240 = (int)local_ba0._0_8_;
    iStack_23c = SUB84(local_ba0._0_8_,4);
    iStack_238 = (int)local_ba0._8_8_;
    iStack_234 = SUB84(local_ba0._8_8_,4);
    local_250 = (int)local_bb0._0_8_;
    iStack_24c = SUB84(local_bb0._0_8_,4);
    iStack_248 = (int)local_bb0._8_8_;
    iStack_244 = SUB84(local_bb0._8_8_,4);
    local_260 = (int)local_c20._0_8_;
    iStack_25c = SUB84(local_c20._0_8_,4);
    iStack_258 = (int)local_c20._8_8_;
    iStack_254 = SUB84(local_c20._8_8_,4);
    local_270 = (int)local_c30._0_8_;
    iStack_26c = SUB84(local_c30._0_8_,4);
    iStack_268 = (int)local_c30._8_8_;
    iStack_264 = SUB84(local_c30._8_8_,4);
    local_280 = (int)local_bc0._0_8_;
    iStack_27c = SUB84(local_bc0._0_8_,4);
    iStack_278 = (int)local_bc0._8_8_;
    iStack_274 = SUB84(local_bc0._8_8_,4);
    local_290 = (int)local_bd0._0_8_;
    iStack_28c = SUB84(local_bd0._0_8_,4);
    iStack_288 = (int)local_bd0._8_8_;
    iStack_284 = SUB84(local_bd0._8_8_,4);
    local_2a0 = (int)local_c40._0_8_;
    iStack_29c = SUB84(local_c40._0_8_,4);
    iStack_298 = (int)local_c40._8_8_;
    iStack_294 = SUB84(local_c40._8_8_,4);
    local_2b0 = (int)local_c50._0_8_;
    iStack_2ac = SUB84(local_c50._0_8_,4);
    iStack_2a8 = (int)local_c50._8_8_;
    iStack_2a4 = SUB84(local_c50._8_8_,4);
    auVar8 = ZEXT416(2);
    local_be0 = local_240 + local_250 >> auVar8;
    iStack_bdc = iStack_23c + iStack_24c >> auVar8;
    iStack_bd8 = iStack_238 + iStack_248 >> auVar8;
    iStack_bd4 = iStack_234 + iStack_244 >> auVar8;
    auVar8 = ZEXT416(2);
    local_bf0 = local_240 - local_250 >> auVar8;
    iStack_bec = iStack_23c - iStack_24c >> auVar8;
    iStack_be8 = iStack_238 - iStack_248 >> auVar8;
    iStack_be4 = iStack_234 - iStack_244 >> auVar8;
    auVar8 = ZEXT416(2);
    local_c00 = local_280 + local_290 >> auVar8;
    iStack_bfc = iStack_27c + iStack_28c >> auVar8;
    iStack_bf8 = iStack_278 + iStack_288 >> auVar8;
    iStack_bf4 = iStack_274 + iStack_284 >> auVar8;
    auVar8 = ZEXT416(2);
    local_c10 = local_280 - local_290 >> auVar8;
    iStack_c0c = iStack_27c - iStack_28c >> auVar8;
    iStack_c08 = iStack_278 - iStack_288 >> auVar8;
    iStack_c04 = iStack_274 - iStack_284 >> auVar8;
    auVar8 = ZEXT416(2);
    auVar9 = ZEXT416(2);
    auVar10 = ZEXT416(2);
    auVar11 = ZEXT416(2);
    auVar4._4_4_ = iStack_bdc;
    auVar4._0_4_ = local_be0;
    auVar4._12_4_ = iStack_bd4;
    auVar4._8_4_ = iStack_bd8;
    auVar5._4_4_ = iStack_25c + iStack_26c >> auVar8;
    auVar5._0_4_ = local_260 + local_270 >> auVar8;
    auVar5._12_4_ = iStack_254 + iStack_264 >> auVar8;
    auVar5._8_4_ = iStack_258 + iStack_268 >> auVar8;
    auVar5 = packssdw(auVar4,auVar5);
    auVar3._4_4_ = iStack_bec;
    auVar3._0_4_ = local_bf0;
    auVar3._12_4_ = iStack_be4;
    auVar3._8_4_ = iStack_be8;
    auVar6._4_4_ = iStack_25c - iStack_26c >> auVar9;
    auVar6._0_4_ = local_260 - local_270 >> auVar9;
    auVar6._12_4_ = iStack_254 - iStack_264 >> auVar9;
    auVar6._8_4_ = iStack_258 - iStack_268 >> auVar9;
    auVar6 = packssdw(auVar3,auVar6);
    auVar2._4_4_ = iStack_bfc;
    auVar2._0_4_ = local_c00;
    auVar2._12_4_ = iStack_bf4;
    auVar2._8_4_ = iStack_bf8;
    auVar7._4_4_ = iStack_29c + iStack_2ac >> auVar10;
    auVar7._0_4_ = local_2a0 + local_2b0 >> auVar10;
    auVar7._12_4_ = iStack_294 + iStack_2a4 >> auVar10;
    auVar7._8_4_ = iStack_298 + iStack_2a8 >> auVar10;
    auVar7 = packssdw(auVar2,auVar7);
    auVar9._4_4_ = iStack_c0c;
    auVar9._0_4_ = local_c10;
    auVar9._12_4_ = iStack_c04;
    auVar9._8_4_ = iStack_c08;
    auVar8._4_4_ = iStack_29c - iStack_2ac >> auVar11;
    auVar8._0_4_ = local_2a0 - local_2b0 >> auVar11;
    auVar8._12_4_ = iStack_294 - iStack_2a4 >> auVar11;
    auVar8._8_4_ = iStack_298 - iStack_2a8 >> auVar11;
    auVar8 = packssdw(auVar9,auVar8);
    local_320 = auVar5._0_2_;
    sStack_31e = auVar5._2_2_;
    sStack_31c = auVar5._4_2_;
    sStack_31a = auVar5._6_2_;
    sStack_318 = auVar5._8_2_;
    sStack_316 = auVar5._10_2_;
    sStack_314 = auVar5._12_2_;
    sStack_312 = auVar5._14_2_;
    local_330 = auVar7._0_2_;
    sStack_32e = auVar7._2_2_;
    sStack_32c = auVar7._4_2_;
    sStack_32a = auVar7._6_2_;
    sStack_328 = auVar7._8_2_;
    sStack_326 = auVar7._10_2_;
    sStack_324 = auVar7._12_2_;
    sStack_322 = auVar7._14_2_;
    local_340 = auVar6._0_2_;
    sStack_33e = auVar6._2_2_;
    sStack_33c = auVar6._4_2_;
    sStack_33a = auVar6._6_2_;
    local_350 = auVar8._0_2_;
    sStack_34e = auVar8._2_2_;
    sStack_34c = auVar8._4_2_;
    sStack_34a = auVar8._6_2_;
    local_340 = local_340 + local_350;
    sStack_33e = sStack_33e + sStack_34e;
    sStack_33c = sStack_33c + sStack_34c;
    sStack_33a = sStack_33a + sStack_34a;
    a[0]._2_2_ = uVar14;
    a[0]._0_2_ = uVar13;
    a[0]._4_2_ = uVar15;
    a[0]._6_2_ = uVar16;
    a[1]._0_2_ = local_340;
    a[1]._2_2_ = sStack_33e;
    a[1]._4_2_ = sStack_33c;
    a[1]._6_2_ = sStack_33a;
    store_tran_low_offset_4(a,ptVar12);
    a_00[0]._2_2_ = uVar14;
    a_00[0]._0_2_ = uVar13;
    a_00[0]._4_2_ = uVar15;
    a_00[0]._6_2_ = uVar16;
    a_00[1]._0_2_ = local_340;
    a_00[1]._2_2_ = sStack_33e;
    a_00[1]._4_2_ = sStack_33c;
    a_00[1]._6_2_ = sStack_33a;
    store_tran_low_offset_4(a_00,ptVar12);
    sStack_318 = sStack_318 - sStack_328;
    sStack_316 = sStack_316 - sStack_326;
    sStack_314 = sStack_314 - sStack_324;
    sStack_312 = sStack_312 - sStack_322;
    ptVar12 = (tran_low_t *)
              CONCAT26(sStack_31a - sStack_32a,
                       CONCAT24(sStack_31c - sStack_32c,
                                CONCAT22(sStack_31e - sStack_32e,local_320 - local_330)));
    a_01[0]._2_2_ = sStack_316;
    a_01[0]._0_2_ = sStack_318;
    a_01[0]._4_2_ = sStack_314;
    a_01[0]._6_2_ = sStack_312;
    a_01[1]._0_2_ = local_340;
    a_01[1]._2_2_ = sStack_33e;
    a_01[1]._4_2_ = sStack_33c;
    a_01[1]._6_2_ = sStack_33a;
    store_tran_low_offset_4(a_01,ptVar12);
    a_02[0]._2_2_ = sStack_316;
    a_02[0]._0_2_ = sStack_318;
    a_02[0]._4_2_ = sStack_314;
    a_02[0]._6_2_ = sStack_312;
    a_02[1]._0_2_ = local_340;
    a_02[1]._2_2_ = sStack_33e;
    a_02[1]._4_2_ = sStack_33c;
    a_02[1]._6_2_ = sStack_33a;
    store_tran_low_offset_4(a_02,ptVar12);
    in_RCX = (long)(int)((local_b8c >> 3 & 1U) * 8 + 4) * 4;
    local_b88 = local_b88 + 0x10;
    in_RDX = extraout_RDX_03;
  }
  return;
}

Assistant:

void aom_hadamard_32x32_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  // For high bitdepths, it is unnecessary to store_tran_low
  // (mult/unpack/store), then load_tran_low (load/pack) the same memory in the
  // next stage.  Output to an intermediate buffer first, then store_tran_low()
  // in the final stage.
  DECLARE_ALIGNED(32, int16_t, temp_coeff[32 * 32]);
  int16_t *t_coeff = temp_coeff;
  int idx;
  __m128i coeff0_lo, coeff1_lo, coeff2_lo, coeff3_lo, b0_lo, b1_lo, b2_lo,
      b3_lo;
  __m128i coeff0_hi, coeff1_hi, coeff2_hi, coeff3_hi, b0_hi, b1_hi, b2_hi,
      b3_hi;
  __m128i b0, b1, b2, b3;
  const __m128i zero = _mm_setzero_si128();
  for (idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 16 * src_stride + (idx & 0x01) * 16;
    hadamard_16x16_sse2(src_ptr, src_stride,
                        (tran_low_t *)(t_coeff + idx * 256), 0);
  }

  for (idx = 0; idx < 256; idx += 8) {
    __m128i coeff0 = _mm_load_si128((const __m128i *)t_coeff);
    __m128i coeff1 = _mm_load_si128((const __m128i *)(t_coeff + 256));
    __m128i coeff2 = _mm_load_si128((const __m128i *)(t_coeff + 512));
    __m128i coeff3 = _mm_load_si128((const __m128i *)(t_coeff + 768));

    // Sign extend 16 bit to 32 bit.
    sign_extend_16bit_to_32bit_sse2(coeff0, zero, &coeff0_lo, &coeff0_hi);
    sign_extend_16bit_to_32bit_sse2(coeff1, zero, &coeff1_lo, &coeff1_hi);
    sign_extend_16bit_to_32bit_sse2(coeff2, zero, &coeff2_lo, &coeff2_hi);
    sign_extend_16bit_to_32bit_sse2(coeff3, zero, &coeff3_lo, &coeff3_hi);

    b0_lo = _mm_add_epi32(coeff0_lo, coeff1_lo);
    b0_hi = _mm_add_epi32(coeff0_hi, coeff1_hi);

    b1_lo = _mm_sub_epi32(coeff0_lo, coeff1_lo);
    b1_hi = _mm_sub_epi32(coeff0_hi, coeff1_hi);

    b2_lo = _mm_add_epi32(coeff2_lo, coeff3_lo);
    b2_hi = _mm_add_epi32(coeff2_hi, coeff3_hi);

    b3_lo = _mm_sub_epi32(coeff2_lo, coeff3_lo);
    b3_hi = _mm_sub_epi32(coeff2_hi, coeff3_hi);

    b0_lo = _mm_srai_epi32(b0_lo, 2);
    b1_lo = _mm_srai_epi32(b1_lo, 2);
    b2_lo = _mm_srai_epi32(b2_lo, 2);
    b3_lo = _mm_srai_epi32(b3_lo, 2);

    b0_hi = _mm_srai_epi32(b0_hi, 2);
    b1_hi = _mm_srai_epi32(b1_hi, 2);
    b2_hi = _mm_srai_epi32(b2_hi, 2);
    b3_hi = _mm_srai_epi32(b3_hi, 2);

    b0 = _mm_packs_epi32(b0_lo, b0_hi);
    b1 = _mm_packs_epi32(b1_lo, b1_hi);
    b2 = _mm_packs_epi32(b2_lo, b2_hi);
    b3 = _mm_packs_epi32(b3_lo, b3_hi);

    coeff0 = _mm_add_epi16(b0, b2);
    coeff1 = _mm_add_epi16(b1, b3);
    store_tran_low_offset_4(coeff0, coeff);
    store_tran_low_offset_4(coeff1, coeff + 256);

    coeff2 = _mm_sub_epi16(b0, b2);
    coeff3 = _mm_sub_epi16(b1, b3);
    store_tran_low_offset_4(coeff2, coeff + 512);
    store_tran_low_offset_4(coeff3, coeff + 768);

    // Increment the pointer by 4 and 12 in alternate iterations(instead of 8)
    // to ensure the coherency with the implementation of
    // store_tran_low_offset_4()
    coeff += (4 + (((idx >> 3) & 1) << 3));
    t_coeff += 8;
  }
}